

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_initialize.c
# Opt level: O1

void lu_initialize(lu_int m,lu_int *istore,double *xstore)

{
  lu this;
  undefined1 local_2d0 [696];
  
  *istore = 0x762672;
  *xstore = 7743090.0;
  xstore[0x40] = (double)m;
  xstore[1] = 0.0;
  xstore[2] = 0.0;
  xstore[3] = 0.0;
  xstore[4] = 1e-20;
  xstore[5] = 1e-14;
  xstore[6] = 0.1;
  xstore[7] = 1.0;
  xstore[8] = 3.0;
  xstore[9] = 4.0;
  xstore[10] = 0.3;
  xstore[0xb] = 0.5;
  xstore[0xc] = 0.05;
  xstore[0xd] = 0.0;
  xstore[0xe] = 1.0;
  xstore[0x48] = 0.0;
  xstore[0x49] = 0.0;
  xstore[0x4a] = 0.0;
  xstore[0x4b] = 0.0;
  xstore[0x55] = 0.0;
  xstore[0x56] = 0.0;
  xstore[0x57] = 0.0;
  lu_load(local_2d0,istore,xstore,(lu_int *)0x0,(double *)0x0,(lu_int *)0x0,(double *)0x0,
          (lu_int *)0x0,(double *)0x0);
  lu_reset(local_2d0);
  lu_save(local_2d0,istore,xstore,0);
  return;
}

Assistant:

void lu_initialize(lu_int m, lu_int *istore, double *xstore)
{
    struct lu this;

    /* set constant entries */
    istore[0]                               = BASICLU_HASH;
    xstore[0]                               = BASICLU_HASH;
    xstore[BASICLU_DIM]                     = m;

    /* set default parameters */
    xstore[BASICLU_MEMORYL]                 = 0;
    xstore[BASICLU_MEMORYU]                 = 0;
    xstore[BASICLU_MEMORYW]                 = 0;
    xstore[BASICLU_DROP_TOLERANCE]          = 1e-20;
    xstore[BASICLU_ABS_PIVOT_TOLERANCE]     = 1e-14;
    xstore[BASICLU_REL_PIVOT_TOLERANCE]     = 0.1;
    xstore[BASICLU_BIAS_NONZEROS]           = 1;
    xstore[BASICLU_MAXN_SEARCH_PIVOT]       = 3;
    xstore[BASICLU_PAD]                     = 4;
    xstore[BASICLU_STRETCH]                 = 0.3;
    xstore[BASICLU_COMPRESSION_THRESHOLD]   = 0.5;
    xstore[BASICLU_SPARSE_THRESHOLD]        = 0.05;
    xstore[BASICLU_REMOVE_COLUMNS]          = 0;
    xstore[BASICLU_SEARCH_ROWS]             = 1;

    /* initialize global counters */
    xstore[BASICLU_NFACTORIZE]              = 0;
    xstore[BASICLU_NUPDATE_TOTAL]           = 0;
    xstore[BASICLU_NFORREST_TOTAL]          = 0;
    xstore[BASICLU_NSYMPERM_TOTAL]          = 0;
    xstore[BASICLU_TIME_FACTORIZE_TOTAL]    = 0;
    xstore[BASICLU_TIME_SOLVE_TOTAL]        = 0;
    xstore[BASICLU_TIME_UPDATE_TOTAL]       = 0;

    /* lu_reset() and lu_save() initializes the remaining slots */
    lu_load(&this, istore, xstore, NULL, NULL, NULL, NULL, NULL, NULL);
    lu_reset(&this);
    lu_save(&this, istore, xstore, BASICLU_OK);
}